

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixNormalsStep.cpp
# Opt level: O2

void __thiscall
Assimp::FixInfacingNormalsProcess::Execute(FixInfacingNormalsProcess *this,aiScene *pScene)

{
  bool bVar1;
  Logger *pLVar2;
  char *message;
  uint a;
  ulong uVar3;
  byte bVar4;
  
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"FixInfacingNormalsProcess begin");
  bVar4 = 0;
  for (uVar3 = 0; uVar3 < pScene->mNumMeshes; uVar3 = uVar3 + 1) {
    bVar1 = ProcessMesh((FixInfacingNormalsProcess *)pLVar2,pScene->mMeshes[uVar3],(uint)uVar3);
    bVar4 = bVar4 | bVar1;
  }
  pLVar2 = DefaultLogger::get();
  message = "FixInfacingNormalsProcess finished. No changes to the scene.";
  if (bVar4 != 0) {
    message = "FixInfacingNormalsProcess finished. Found issues.";
  }
  Logger::debug(pLVar2,message);
  return;
}

Assistant:

void FixInfacingNormalsProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("FixInfacingNormalsProcess begin");

    bool bHas( false );
    for (unsigned int a = 0; a < pScene->mNumMeshes; ++a) {
        if (ProcessMesh(pScene->mMeshes[a], a)) {
            bHas = true;
        }
    }

    if (bHas) {
        ASSIMP_LOG_DEBUG("FixInfacingNormalsProcess finished. Found issues.");
    } else {
        ASSIMP_LOG_DEBUG("FixInfacingNormalsProcess finished. No changes to the scene.");
    }
}